

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall
r_comp::Decompiler::decompile_object
          (Decompiler *this,uint16_t object_index,ostringstream *stream,uint64_t time_offset)

{
  pointer pfVar1;
  void *pvVar2;
  SysObject *pSVar3;
  pointer pcVar4;
  ostream *poVar5;
  SysView *pSVar6;
  byte bVar7;
  ushort uVar8;
  OutStream *pOVar9;
  SysObject **ppSVar10;
  iterator iVar11;
  pointer ppSVar12;
  mapped_type *pmVar13;
  offset_in_Decompiler_to_subr *poVar14;
  SysView **ppSVar15;
  code *pcVar16;
  long *plVar17;
  ulong uVar18;
  size_t i;
  string s;
  uint16_t local_52;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  pOVar9 = this->out_stream;
  local_52 = object_index;
  if (pOVar9 != (OutStream *)0x0) {
    if (pOVar9->stream == stream) goto LAB_0013271d;
    pfVar1 = (pOVar9->positions).m_vector.
             super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    pvVar2 = (pOVar9->code_indexes_to_stream_indexes).m_vector.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    operator_delete(pOVar9);
  }
  pOVar9 = (OutStream *)operator_new(0x40);
  (pOVar9->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar9->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar9->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pOVar9->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar9->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar9->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar9->stream = stream;
  this->out_stream = pOVar9;
LAB_0013271d:
  this->time_offset = time_offset;
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->variable_names)._M_h);
  this->last_variable_id = 0;
  ppSVar10 = r_code::vector<r_code::SysObject_*>::operator[]
                       (&(this->image->code_segment).objects,(ulong)object_index);
  pSVar3 = *ppSVar10;
  this->current_object = (ImageObject *)pSVar3;
  this->indents = 0;
  if ((this->partial_decompilation == false) && (this->ignore_named_objects == true)) {
    local_50 = (char *)CONCAT62(local_50._2_6_,*(undefined2 *)(pSVar3 + 0x68));
    iVar11 = std::
             _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->named_objects)._M_h,(key_type *)&local_50);
    if (iVar11.super__Node_iterator_base<unsigned_short,_false>._M_cur != (__node_type *)0x0) {
      return;
    }
  }
  else {
    for (ppSVar12 = (this->imported_objects).
                    super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppSVar12 !=
        (this->imported_objects).
        super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppSVar12 = ppSVar12 + 1) {
      if (pSVar3 == *ppSVar12) {
        local_50 = (char *)CONCAT62(local_50._2_6_,*(undefined2 *)(pSVar3 + 0x68));
        iVar11 = std::
                 _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&(this->named_objects)._M_h,(key_type *)&local_50);
        if (iVar11.super__Node_iterator_base<unsigned_short,_false>._M_cur != (__node_type *)0x0) {
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this->out_stream->stream,"imported\n",9);
        break;
      }
    }
  }
  pmVar13 = std::__detail::
            _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->object_names,&local_52);
  pcVar4 = (pmVar13->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + pmVar13->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this->out_stream->stream,local_50,local_48);
  this->horizontal_set = false;
  r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),0);
  uVar8 = r_code::Atom::asOpcode();
  poVar14 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                      (&this->renderers,(ulong)uVar8);
  pcVar16 = (code *)*poVar14;
  plVar17 = (long *)((long)&this->out_stream + poVar14[1]);
  if (((ulong)pcVar16 & 1) != 0) {
    pcVar16 = *(code **)(pcVar16 + *plVar17 + -1);
  }
  (*pcVar16)(plVar17,0);
  uVar18 = *(long *)(pSVar3 + 0x58) - *(long *)(pSVar3 + 0x50);
  poVar5 = (ostream *)this->out_stream->stream;
  if ((uVar18 & 0x7fff8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," |[]",4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," []",3);
    if ((uVar18 & 0x7fff8) != 0) {
      i = 0;
      do {
        write_indent(this,3);
        ppSVar15 = r_code::vector<r_code::SysView_*>::operator[]
                             ((vector<r_code::SysView_*> *)(pSVar3 + 0x50),i);
        pSVar6 = *ppSVar15;
        this->current_object = (ImageObject *)pSVar6;
        r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pSVar6 + 8),0);
        bVar7 = r_code::Atom::getAtomCount();
        write_view(this,0,(ushort)bVar7);
        i = i + 1;
      } while ((ushort)i < (ushort)((uint)uVar18 >> 3));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,"\n",1);
  this->indents = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->out_stream->stream,"\n",1);
  this->indents = 0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void Decompiler::decompile_object(uint16_t object_index, std::ostringstream *stream, uint64_t time_offset)
{
    if (!out_stream) {
        out_stream = new OutStream(stream);
    } else if (out_stream->stream != stream) {
        delete out_stream;
        out_stream = new OutStream(stream);
    }

    this->time_offset = time_offset;
    variable_names.clear();
    last_variable_id = 0;
    current_object = image->code_segment.objects[object_index];
    SysObject *sys_object = (SysObject *)current_object;
    uint16_t read_index = 0;
    indents = 0;

    if (!partial_decompilation && ignore_named_objects) { // decompilation of the entire memory.
        if (named_objects.find(sys_object->oid) != named_objects.end()) {
            return;
        }
    } else { // decompiling on-the-fly: ignore named objects only if imported.
        bool imported = false;

        for (SysObject *object : imported_objects) {
            if (sys_object == object) {
                imported = true;
                break;
            }
        }

        if (imported) {
            if (named_objects.find(sys_object->oid) != named_objects.end()) {
                return;
            } else {
                *out_stream << "imported\n";
            }
        } else if (sys_object->oid != UINT32_MAX) {
//            *out_stream << "oid: " << sys_object->oid << "\n";
        }
    }

    std::string s = object_names[object_index];
    s += ":";
    *out_stream << s;
    horizontal_set = false;
    (this->*renderers[current_object->code[read_index].asOpcode()])(read_index);
    uint16_t view_count = sys_object->views.size();

    if (view_count) { // write the set of views
        *out_stream << " []";

        for (uint16_t i = 0; i < view_count; ++i) {
            write_indent(3);
            current_object = sys_object->views[i];
            write_view(0, current_object->code[0].getAtomCount());
        }
    } else {
        *out_stream << " |[]";
    }

    write_indent(0);
    write_indent(0);
}